

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void google::protobuf::ExtensionRangeOptions::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  HasBits<1> *pHVar1;
  uint uVar2;
  MessageLite *from_msg_00;
  MessageLite *to_msg_00;
  char *failure_msg;
  void *pvVar3;
  int line;
  Arena *arena;
  ExtensionRangeOptions *_this;
  ExtensionRangeOptions *local_30;
  MessageLite *local_28 [2];
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  local_30 = (ExtensionRangeOptions *)to_msg;
  local_28[0] = from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<google::protobuf::ExtensionRangeOptions_const*,google::protobuf::ExtensionRangeOptions*>
                          ((ExtensionRangeOptions **)local_28,&local_30,"&from != _this");
  if (failure_msg != (Nullable<const_char_*>)0x0) {
    line = 0x145a;
LAB_00c2bef2:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
               ,line,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_28)
    ;
  }
  RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration>::MergeFrom
            (&(local_30->field_0)._impl_.declaration_,
             (RepeatedPtrField<google::protobuf::ExtensionRangeOptions_Declaration> *)(from_msg + 3)
            );
  RepeatedPtrField<google::protobuf::UninterpretedOption>::MergeFrom
            (&(local_30->field_0)._impl_.uninterpreted_option_,
             (RepeatedPtrField<google::protobuf::UninterpretedOption> *)
             &from_msg[4]._internal_metadata_);
  uVar2 = (uint)from_msg[2]._internal_metadata_.ptr_;
  if ((uVar2 & 3) != 0) {
    if ((uVar2 & 1) != 0) {
      from_msg_00 = (MessageLite *)from_msg[6]._vptr_MessageLite;
      if (from_msg_00 == (MessageLite *)0x0) {
        failure_msg = "from._impl_.features_ != nullptr";
        line = 0x1465;
        goto LAB_00c2bef2;
      }
      to_msg_00 = *(MessageLite **)((long)&local_30->field_0 + 0x50);
      if (to_msg_00 == (MessageLite *)0x0) {
        pvVar3 = Arena::CopyConstruct<google::protobuf::FeatureSet>(arena,from_msg_00);
        *(void **)((long)&local_30->field_0 + 0x50) = pvVar3;
      }
      else {
        FeatureSet::MergeImpl(to_msg_00,from_msg_00);
      }
    }
    if ((uVar2 & 2) != 0) {
      *(int *)((long)&local_30->field_0 + 0x58) = (int)from_msg[6]._internal_metadata_.ptr_;
    }
  }
  pHVar1 = &(local_30->field_0)._impl_._has_bits_;
  pHVar1->has_bits_[0] = pHVar1->has_bits_[0] | uVar2;
  internal::ExtensionSet::MergeFrom
            (&(local_30->field_0)._impl_._extensions_,
             (MessageLite *)_ExtensionRangeOptions_default_instance_,(ExtensionSet *)(from_msg + 1))
  ;
  internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(local_30->super_Message).super_MessageLite._internal_metadata_,
             &from_msg->_internal_metadata_);
  return;
}

Assistant:

void ExtensionRangeOptions::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<ExtensionRangeOptions*>(&to_msg);
  auto& from = static_cast<const ExtensionRangeOptions&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.ExtensionRangeOptions)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_declaration()->MergeFrom(
      from._internal_declaration());
  _this->_internal_mutable_uninterpreted_option()->MergeFrom(
      from._internal_uninterpreted_option());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      ABSL_DCHECK(from._impl_.features_ != nullptr);
      if (_this->_impl_.features_ == nullptr) {
        _this->_impl_.features_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.features_);
      } else {
        _this->_impl_.features_->MergeFrom(*from._impl_.features_);
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_impl_.verification_ = from._impl_.verification_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_impl_._extensions_.MergeFrom(&default_instance(), from._impl_._extensions_);
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}